

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_map_iterator_next
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,BOOL *pdone,int magic)

{
  int iVar1;
  int *piVar2;
  JSRuntime *pJVar3;
  long lVar4;
  undefined1 auVar5 [16];
  JSValue *pJVar6;
  uint uVar7;
  long *plVar8;
  JSValueUnion *pJVar9;
  long lVar10;
  ulong uVar11;
  JSValue JVar12;
  JSValue JVar13;
  JSValueUnion local_58;
  long lStack_50;
  JSValueUnion local_48;
  JSValueUnion JStack_40;
  
  pJVar6 = (JSValue *)JS_GetOpaque2(ctx,this_val,magic + 0x23);
  if (pJVar6 == (JSValue *)0x0) {
    *pdone = 0;
    uVar11 = 6;
  }
  else {
    iVar1 = (int)pJVar6->tag;
    if (iVar1 != 3) {
      local_58.ptr = (pJVar6->u).ptr;
      if ((iVar1 == -1) && (magic + 0x1fU == (uint)*(ushort *)((long)local_58.ptr + 6))) {
        lVar10 = *(long *)((long)local_58.ptr + 0x30);
      }
      else {
        lVar10 = 0;
      }
      piVar2 = (int *)pJVar6[1].tag;
      if (piVar2 == (int *)0x0) {
        plVar8 = *(long **)(lVar10 + 0x10);
      }
      else {
        plVar8 = *(long **)(piVar2 + 8);
        pJVar3 = ctx->rt;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          lVar4 = *(long *)(piVar2 + 6);
          *(long **)(lVar4 + 8) = plVar8;
          *plVar8 = lVar4;
          piVar2[6] = 0;
          piVar2[7] = 0;
          piVar2[8] = 0;
          piVar2[9] = 0;
          (*(pJVar3->mf).js_free)(&pJVar3->malloc_state,piVar2);
        }
      }
      for (; plVar8 != (long *)(lVar10 + 8); plVar8 = (long *)plVar8[1]) {
        if (*(int *)((long)plVar8 + -0x14) == 0) {
          *(int *)(plVar8 + -3) = (int)plVar8[-3] + 1;
          pJVar6[1].tag = (int64_t)(plVar8 + -3);
          *pdone = 0;
          if (pJVar6[1].u.int32 == 0) {
            local_48 = (JSValueUnion)((JSValueUnion *)(plVar8 + 4))->ptr;
            JStack_40 = *(JSValueUnion *)(plVar8 + 5);
            JVar13 = *(JSValue *)(plVar8 + 4);
            uVar7 = JStack_40.int32;
joined_r0x001487dc:
            if (0xfffffff4 < uVar7) {
              JVar13.tag = (int64_t)JStack_40.ptr;
              JVar13.u.ptr = local_48.ptr;
              *(int *)local_48.ptr = *local_48.ptr + 1;
            }
          }
          else {
            local_58 = *(JSValueUnion *)(plVar8 + 4);
            lStack_50 = plVar8[5];
            pJVar9 = (JSValueUnion *)(plVar8 + 6);
            if (magic != 0) {
              pJVar9 = (JSValueUnion *)(plVar8 + 4);
            }
            local_48 = (JSValueUnion)pJVar9->ptr;
            JStack_40 = pJVar9[1];
            JVar13 = *(JSValue *)pJVar9;
            if (pJVar6[1].u.int32 == 1) {
              uVar7 = JStack_40.int32;
              goto joined_r0x001487dc;
            }
            JVar13 = js_create_array(ctx,2,(JSValue *)&local_58);
          }
          uVar11 = (ulong)JVar13.u.ptr & 0xffffffff00000000;
          goto LAB_00148755;
        }
      }
      pJVar6[1].tag = 0;
      local_58.ptr = (pJVar6->u).ptr;
      JVar13 = *pJVar6;
      if ((0xfffffff4 < (uint)pJVar6->tag) &&
         (iVar1 = *local_58.ptr, *(int *)local_58.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar13);
      }
      (pJVar6->u).int32 = 0;
      pJVar6->tag = 3;
    }
    *pdone = 1;
    uVar11 = 3;
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar11;
  JVar13 = (JSValue)(auVar5 << 0x40);
  uVar11 = 0;
LAB_00148755:
  JVar12.tag = JVar13.tag;
  JVar12.u.ptr = (void *)((ulong)JVar13.u.ptr & 0xffffffff | uVar11);
  return JVar12;
}

Assistant:

static JSValue js_map_iterator_next(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv,
                                    BOOL *pdone, int magic)
{
    JSMapIteratorData *it;
    JSMapState *s;
    JSMapRecord *mr;
    struct list_head *el;

    it = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP_ITERATOR + magic);
    if (!it) {
        *pdone = FALSE;
        return JS_EXCEPTION;
    }
    if (JS_IsUndefined(it->obj))
        goto done;
    s = JS_GetOpaque(it->obj, JS_CLASS_MAP + magic);
    assert(s != NULL);
    if (!it->cur_record) {
        el = s->records.next;
    } else {
        mr = it->cur_record;
        el = mr->link.next;
        map_decref_record(ctx->rt, mr); /* the record can be freed here */
    }
    for(;;) {
        if (el == &s->records) {
            /* no more record  */
            it->cur_record = NULL;
            JS_FreeValue(ctx, it->obj);
            it->obj = JS_UNDEFINED;
        done:
            /* end of enumeration */
            *pdone = TRUE;
            return JS_UNDEFINED;
        }
        mr = list_entry(el, JSMapRecord, link);
        if (!mr->empty)
            break;
        /* get the next record */
        el = mr->link.next;
    }

    /* lock the record so that it won't be freed */
    mr->ref_count++;
    it->cur_record = mr;
    *pdone = FALSE;

    if (it->kind == JS_ITERATOR_KIND_KEY) {
        return JS_DupValue(ctx, mr->key);
    } else {
        JSValueConst args[2];
        args[0] = mr->key;
        if (magic)
            args[1] = mr->key;
        else
            args[1] = mr->value;
        if (it->kind == JS_ITERATOR_KIND_VALUE) {
            return JS_DupValue(ctx, args[1]);
        } else {
            return js_create_array(ctx, 2, args);
        }
    }
}